

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O1

void * fits_recalloc(void *ptr,size_t old_num,size_t new_num,size_t size)

{
  void *pvVar1;
  
  if (ptr == (void *)0x0 || old_num == 0) {
    pvVar1 = calloc(new_num,size);
    return pvVar1;
  }
  if (new_num == old_num) {
    return ptr;
  }
  if (new_num != 0) {
    pvVar1 = realloc(ptr,size * new_num);
    if (new_num < old_num) {
      if (pvVar1 != (void *)0x0) {
        return pvVar1;
      }
      free(ptr);
      return (void *)0x0;
    }
    if (pvVar1 != (void *)0x0) {
      memset((void *)((long)pvVar1 + old_num * size),0,(new_num - old_num) * size);
      return pvVar1;
    }
  }
  free(ptr);
  return (void *)0x0;
}

Assistant:

void *fits_recalloc(void *ptr, size_t old_num, size_t new_num, size_t size)
{
  void *newptr;

  if (ptr == 0 || old_num == 0) { /* Starting from nothing */

    return calloc(new_num, size);

  } else if (new_num == old_num) { /* Same size, do nothing */
    
    return ptr;

  } else if (new_num == 0) { /* Freeing */

    if (ptr) free(ptr);
    return 0;

  } else if (new_num < old_num) { /* Shrinking */
    
    newptr = realloc(ptr, new_num*size);
    if (!newptr) free(ptr);
    return (newptr);
  }

  /* Growing */
  newptr = realloc(ptr, new_num*size);
  if (!newptr) {
    free(ptr);
    return newptr;
  }

  /* Zero the new portion of the array */
  memset( (char *) newptr + old_num*size/sizeof(char), 0,
	  (new_num - old_num)*size );
  return (newptr);
}